

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

int adios2::utils::print_data_as_string(void *data,int maxlen,DataType adiosvartype)

{
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  int len;
  char *str;
  uint local_24;
  int local_4;
  
  local_24 = in_ESI;
  if (((in_EDX == 1) || (in_EDX == 5)) || (in_EDX == 0xe)) {
    while (*(char *)(in_RDI + (int)(local_24 - 1)) == '\0') {
      local_24 = local_24 - 1;
    }
    if ((int)local_24 < (int)in_ESI) {
      fprintf(outf,"\"%s\"",in_RDI);
    }
    else {
      while (*(char *)(in_RDI + (int)(local_24 - 1)) == ' ') {
        local_24 = local_24 - 1;
      }
      fprintf(outf,"\"%*.*s\"",(ulong)local_24,(ulong)local_24,in_RDI);
      if ((int)local_24 < (int)in_ESI) {
        fprintf(outf," + %d spaces",(ulong)(in_ESI - local_24));
      }
    }
    local_4 = 0;
  }
  else {
    fprintf(_stderr,"Error in bpls code: cannot use print_data_as_string() for type \"%d\"\n",
            (ulong)in_EDX);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int print_data_as_string(const void *data, int maxlen, DataType adiosvartype)
{
    const char *str = (const char *)data;
    int len = maxlen;
    switch (adiosvartype)
    {
    case DataType::UInt8:
    case DataType::Int8:
    case DataType::String:
        while (str[len - 1] == 0)
        {
            len--;
        } // go backwards on ascii 0s
        if (len < maxlen)
        {
            // it's a C string with terminating \0
            fprintf(outf, "\"%s\"", str);
        }
        else
        {
            // fortran VARCHAR, lets trim from right padded zeros
            while (str[len - 1] == ' ')
            {
                len--;
            }
            fprintf(outf, "\"%*.*s\"", len, len, (char *)data);
            if (len < maxlen)
                fprintf(outf, " + %d spaces", maxlen - len);
        }
        break;
    default:
        fprintf(stderr,
                "Error in bpls code: cannot use print_data_as_string() "
                "for type \"%d\"\n",
                static_cast<typename std::underlying_type<DataType>::type>(adiosvartype));
        return -1;
    }
    return 0;
}